

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGitter.cpp
# Opt level: O0

void __thiscall SudokuGitter::print(SudokuGitter *this)

{
  uint uVar1;
  ostream *poVar2;
  uint local_18;
  uint local_14;
  uint icol;
  uint irow;
  SudokuGitter *this_local;
  
  local_14 = 0;
  while( true ) {
    uVar1 = getElements(this);
    if (uVar1 <= local_14) break;
    std::operator<<((ostream *)&std::cout," ");
    local_18 = 0;
    while( true ) {
      uVar1 = getElements(this);
      if (uVar1 <= local_18) break;
      uVar1 = getCellValue(this,local_14,local_18);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar1);
      std::operator<<(poVar2," ");
      local_18 = local_18 + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void SudokuGitter::print() {
    for (unsigned int irow = 0; irow < getElements(); ++irow) {
        std::cout << " ";
        for (unsigned int icol = 0; icol < getElements(); ++icol) {
            std::cout << getCellValue(irow, icol) << " ";
        }
        std::cout << std::endl; // << "--" << std::endl;
    }
}